

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

string * __thiscall
fmt::v7::detail::stringifier::operator()[abi_cxx11_
          (string *__return_storage_ptr__,stringifier *this,handle h)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_00;
  memory_buffer buf;
  parse_context local_258;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> local_240;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_220;
  
  local_220.super_buffer<char>.ptr_ = local_220.store_;
  local_220.super_buffer<char>.size_ = 0;
  local_220.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00321df0;
  local_258.next_arg_id_ = 0;
  local_220.super_buffer<char>.capacity_ = 500;
  local_240.out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)&local_220;
  local_240.args_.desc_ = 0;
  local_258.format_str_.data_ = (char *)0x0;
  local_258.format_str_.size_ = 0;
  local_240.loc_.locale_ = (void *)0x0;
  (*h.custom_.format)(h.custom_.value,&local_258,&local_240);
  to_string<char,500ul>(__return_storage_ptr__,(v7 *)&local_220,buf_00);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(basic_format_arg<format_context>::handle h) const {
    memory_buffer buf;
    format_parse_context parse_ctx({});
    format_context format_ctx(buffer_appender<char>(buf), {}, {});
    h.format(parse_ctx, format_ctx);
    return to_string(buf);
  }